

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_variantSetStmt
                   (string *__return_storage_ptr__,
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                   *vslist,uint32_t indent)

{
  ulong uVar1;
  size_t this;
  reference_conflict s;
  reference_conflict s_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *this_00;
  bool bVar2;
  ostream *poVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
  *this_01;
  PrimMeta *pPVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *props;
  size_type sVar5;
  const_reference this_02;
  string *psVar6;
  const_reference pvVar7;
  pointer ppVar8;
  value *pvVar9;
  uint32_t uVar10;
  size_type in_RCX;
  uint32_t n;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t n_02;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  undefined1 in_R8B;
  string local_450;
  string local_430;
  string local_410;
  reference local_3f0;
  Prim *child;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range4;
  _Self local_3b0;
  _Self local_3a8;
  iterator it;
  token nameTok;
  size_t i_1;
  const_reference local_368;
  ulong local_360;
  size_t i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
  primNameTable;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *variantPrimChildren;
  PrimMeta *variantPrimMetas;
  string local_2f8;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  string local_290;
  string local_270;
  reference_conflict local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_conflict
  *item;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
  *__range2;
  string local_228;
  string local_208;
  string local_1e8;
  reference_conflict local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_conflict
  *variantSet;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *__range1;
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *pmStack_18;
  uint32_t indent_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
  *vslist_local;
  
  local_1c = indent;
  pmStack_18 = vslist;
  vslist_local = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                  *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  this_00 = pmStack_18;
  __end1 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
           ::begin(pmStack_18);
  variantSet = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_conflict
                *)::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
                  ::end(this_00);
  while (bVar2 = ::std::operator!=(&__end1,(_Self *)&variantSet), bVar2) {
    local_1c8 = ::std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>
                ::operator*(&__end1);
    bVar2 = ::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
            ::empty(&(local_1c8->second).variantSet);
    if (!bVar2) {
      pprint::Indent_abi_cxx11_(&local_1e8,(pprint *)(ulong)local_1c,n);
      poVar3 = ::std::operator<<(aoStack_198,(string *)&local_1e8);
      poVar3 = ::std::operator<<(poVar3,"variantSet ");
      s_00 = local_1c8;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_228,"\"",(allocator *)((long)&__range2 + 7));
      quote(&local_208,&s_00->first,&local_228);
      poVar3 = ::std::operator<<(poVar3,(string *)&local_208);
      ::std::operator<<(poVar3," = {\n");
      ::std::__cxx11::string::~string((string *)&local_208);
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      ::std::__cxx11::string::~string((string *)&local_1e8);
      this_01 = &(local_1c8->second).variantSet;
      __end2 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
               ::begin(this_01);
      item = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_conflict
              *)::std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>_>
                ::end(this_01);
      while( true ) {
        bVar2 = ::std::operator!=(&__end2,(_Self *)&item);
        uVar10 = (uint32_t)in_RCX;
        if (!bVar2) break;
        local_250 = ::std::
                    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>
                    ::operator*(&__end2);
        pprint::Indent_abi_cxx11_(&local_270,(pprint *)(ulong)(local_1c + 1),n_01);
        poVar3 = ::std::operator<<(aoStack_198,(string *)&local_270);
        s = local_250;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2b0,"\"",&local_2b1);
        quote(&local_290,&s->first,&local_2b0);
        poVar3 = ::std::operator<<(poVar3,(string *)&local_290);
        ::std::operator<<(poVar3," ");
        ::std::__cxx11::string::~string((string *)&local_290);
        ::std::__cxx11::string::~string((string *)&local_2b0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        ::std::__cxx11::string::~string((string *)&local_270);
        pPVar4 = Variant::metas(&local_250->second);
        bVar2 = PrimMetas::authored(pPVar4);
        if (bVar2) {
          ::std::operator<<(aoStack_198,"(\n");
          pPVar4 = Variant::metas(&local_250->second);
          print_prim_metas_abi_cxx11_
                    (&local_2d8,(tinyusdz *)pPVar4,(PrimMeta *)(ulong)(local_1c + 2),uVar10);
          ::std::operator<<(aoStack_198,(string *)&local_2d8);
          ::std::__cxx11::string::~string((string *)&local_2d8);
          pprint::Indent_abi_cxx11_(&local_2f8,(pprint *)(ulong)(local_1c + 1),n_02);
          poVar3 = ::std::operator<<(aoStack_198,(string *)&local_2f8);
          ::std::operator<<(poVar3,") ");
          ::std::__cxx11::string::~string((string *)&local_2f8);
        }
        ::std::operator<<(aoStack_198,"{\n");
        props = Variant::properties_abi_cxx11_(&local_250->second);
        print_props((string *)&variantPrimMetas,props,local_1c + 2);
        ::std::operator<<(aoStack_198,(string *)&variantPrimMetas);
        ::std::__cxx11::string::~string((string *)&variantPrimMetas);
        pPVar4 = Variant::metas(&local_250->second);
        primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)Variant::primChildren(&local_250->second);
        sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                           &pPVar4->primChildren);
        in_RCX = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                            primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
        this = primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (sVar5 == in_RCX) {
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 *)&i);
          for (local_360 = 0; uVar1 = local_360,
              sVar5 = std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::size
                                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                                 primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count),
              uVar1 < sVar5; local_360 = local_360 + 1) {
            this_02 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                                 primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 local_360);
            psVar6 = Prim::element_name_abi_cxx11_(this_02);
            local_368 = ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::operator[]
                                  ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                                   primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   local_360);
            ::std::
            map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
            ::emplace<std::__cxx11::string_const&,tinyusdz::Prim_const*>
                      ((map<std::__cxx11::string,tinyusdz::Prim_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Prim_const*>>>
                        *)&i,psVar6,&local_368);
          }
          for (nameTok.str_.field_2._8_8_ = 0;
              in_RCX = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  &pPVar4->primChildren), (ulong)nameTok.str_.field_2._8_8_ < in_RCX
              ; nameTok.str_.field_2._8_8_ = nameTok.str_.field_2._8_8_ + 1) {
            pvVar7 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::operator[]
                               (&pPVar4->primChildren,nameTok.str_.field_2._8_8_);
            Token::Token((Token *)&it,pvVar7);
            psVar6 = Token::str_abi_cxx11_((Token *)&it);
            local_3a8._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                         *)&i,psVar6);
            local_3b0._M_node =
                 (_Base_ptr)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                        *)&i);
            bVar2 = ::std::operator!=(&local_3a8,&local_3b0);
            if (bVar2) {
              ppVar8 = ::std::
                       _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>
                       ::operator->(&local_3a8);
              pvVar9 = (value *)Prim::data(ppVar8->second);
              value::pprint_value_abi_cxx11_
                        ((string *)&__range4,pvVar9,(Value *)(ulong)(local_1c + 2),1,(bool)in_R8B);
              ::std::operator<<(aoStack_198,(string *)&__range4);
              ::std::__cxx11::string::~string((string *)&__range4);
            }
            Token::~Token((Token *)&it);
          }
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::Prim_*>_>_>
                  *)&i);
          uVar10 = extraout_EDX;
        }
        else {
          __end4._M_current =
               (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                                 ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)
                                  primNameTable._M_t._M_impl.super__Rb_tree_header._M_node_count);
          child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                                    ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this
                                    );
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                             *)&child), uVar10 = extraout_EDX_00, bVar2) {
            local_3f0 = __gnu_cxx::
                        __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                        ::operator*(&__end4);
            pvVar9 = (value *)Prim::data(local_3f0);
            in_RCX = 1;
            value::pprint_value_abi_cxx11_
                      (&local_410,pvVar9,(Value *)(ulong)(local_1c + 2),1,(bool)in_R8B);
            ::std::operator<<(aoStack_198,(string *)&local_410);
            ::std::__cxx11::string::~string((string *)&local_410);
            __gnu_cxx::
            __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
            ::operator++(&__end4);
          }
        }
        pprint::Indent_abi_cxx11_(&local_430,(pprint *)(ulong)(local_1c + 1),uVar10);
        poVar3 = ::std::operator<<(aoStack_198,(string *)&local_430);
        ::std::operator<<(poVar3,"}\n");
        ::std::__cxx11::string::~string((string *)&local_430);
        ::std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Variant>_>
        ::operator++(&__end2);
      }
      pprint::Indent_abi_cxx11_(&local_450,(pprint *)(ulong)local_1c,n_00);
      poVar3 = ::std::operator<<(aoStack_198,(string *)&local_450);
      ::std::operator<<(poVar3,"}\n");
      ::std::__cxx11::string::~string((string *)&local_450);
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>
    ::operator++(&__end1);
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string print_variantSetStmt(
    const std::map<std::string, VariantSet> &vslist, const uint32_t indent) {
  std::stringstream ss;

  // ss << "# variantSet.size = " << std::to_string(vslist.size()) << "\n";
  for (const auto &variantSet : vslist) {
    if (variantSet.second.variantSet.empty()) {
      continue;
    }

    ss << pprint::Indent(indent) << "variantSet " << quote(variantSet.first)
       << " = {\n";

    for (const auto &item : variantSet.second.variantSet) {
      ss << pprint::Indent(indent + 1) << quote(item.first) << " ";

      if (item.second.metas().authored()) {
        ss << "(\n";
        ss << print_prim_metas(item.second.metas(), indent + 2);
        ss << pprint::Indent(indent + 1) << ") ";
      }

      ss << "{\n";

      // props
      ss << print_props(item.second.properties(), indent + 2);

      // primChildren
      // TODO: print child Prims based on `primChildren` Prim metadata
      const auto &variantPrimMetas = item.second.metas();
      const auto &variantPrimChildren = item.second.primChildren();

      if (variantPrimMetas.primChildren.size() == variantPrimChildren.size()) {
        std::map<std::string, const Prim *> primNameTable;
        for (size_t i = 0; i < variantPrimChildren.size(); i++) {
          primNameTable.emplace(variantPrimChildren[i].element_name(),
                                &variantPrimChildren[i]);
        }

        for (size_t i = 0; i < variantPrimMetas.primChildren.size(); i++) {
          value::token nameTok = variantPrimMetas.primChildren[i];
          DCOUT(fmt::format("variantPrimChildren  {}/{} = {}", i,
                            variantPrimMetas.primChildren.size(),
                            nameTok.str()));
          const auto it = primNameTable.find(nameTok.str());
          if (it != primNameTable.end()) {
            ss << pprint_value(it->second->data(), indent + 2,
                               /* closing_brace */ true);
          } else {
            // TODO: Report warning?
          }
        }
      } else {
        for (const auto &child : variantPrimChildren) {
          ss << pprint_value(child.data(), indent + 2,
                             /* closing_brace */ true);
        }
      }

      // ss << "# variantSet end\n";
      ss << pprint::Indent(indent + 1) << "}\n";
    }

    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}